

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCopier::Parse(cmFileCopier *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  pointer pbVar1;
  cmCommand *pcVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  string local_1c0;
  ostringstream e;
  
  this->Doing = 3;
  uVar5 = 1;
  do {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar5) {
      if ((this->Destination)._M_string_length != 0) {
        if ((this->UseGivenPermissionsFile == false) && (this->UseSourcePermissions == false)) {
          (*this->_vptr_cmFileCopier[9])(this);
        }
        if (this->UseGivenPermissionsDir == false) {
          if (this->UseSourcePermissions == false) {
            (*this->_vptr_cmFileCopier[10])(this);
            return true;
          }
          return true;
        }
        return true;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar4 = std::operator<<((ostream *)&e,this->Name);
      std::operator<<(poVar4," given no DESTINATION");
      pcVar2 = &this->FileCommand->super_cmCommand;
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(pcVar2,&local_1c0);
LAB_002a632e:
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      return false;
    }
    iVar3 = (*this->_vptr_cmFileCopier[7])(this,pbVar1 + uVar5);
    if (((char)iVar3 == '\0') &&
       (iVar3 = (*this->_vptr_cmFileCopier[8])
                          (this,(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar5),
       (char)iVar3 == '\0')) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar4 = std::operator<<((ostream *)&e,"called with unknown argument \"");
      poVar4 = std::operator<<(poVar4,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar5));
      std::operator<<(poVar4,"\".");
      pcVar2 = &this->FileCommand->super_cmCommand;
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(pcVar2,&local_1c0);
      goto LAB_002a632e;
    }
    uVar5 = (ulong)((int)uVar5 + 1);
    if (this->Doing == 1) {
      return false;
    }
  } while( true );
}

Assistant:

bool cmFileCopier::Parse(std::vector<std::string> const& args)
{
  this->Doing = DoingFiles;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    // Check this argument.
    if(!this->CheckKeyword(args[i]) &&
       !this->CheckValue(args[i]))
      {
      std::ostringstream e;
      e << "called with unknown argument \"" << args[i] << "\".";
      this->FileCommand->SetError(e.str());
      return false;
      }

    // Quit if an argument is invalid.
    if(this->Doing == DoingError)
      {
      return false;
      }
    }

  // Require a destination.
  if(this->Destination.empty())
    {
    std::ostringstream e;
    e << this->Name << " given no DESTINATION";
    this->FileCommand->SetError(e.str());
    return false;
    }

  // If file permissions were not specified set default permissions.
  if(!this->UseGivenPermissionsFile && !this->UseSourcePermissions)
    {
    this->DefaultFilePermissions();
    }

  // If directory permissions were not specified set default permissions.
  if(!this->UseGivenPermissionsDir && !this->UseSourcePermissions)
    {
    this->DefaultDirectoryPermissions();
    }

  return true;
}